

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_mul_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<float,_3> res;
  float local_30 [3];
  undefined8 local_24;
  float local_1c;
  int local_18 [6];
  
  local_30[0] = c->in[0].m_data[2];
  local_30[1] = c->in[0].m_data[0];
  local_30[2] = c->in[0].m_data[1];
  local_24 = *(undefined8 *)(c->in[1].m_data + 1);
  local_1c = c->in[1].m_data[0];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = local_30[lVar1] * *(float *)((long)&local_24 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[local_18[lVar1]] = res.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }